

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<sjtu::userType_*,_long> __thiscall
sjtu::FileManager<sjtu::userType>::newspace(FileManager<sjtu::userType> *this)

{
  long in_RDI;
  userType **__x;
  pair<sjtu::userType_*,_long> pVar1;
  LRUCache<sjtu::userType> *unaff_retaddr;
  locType offset;
  userType tmp;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar2;
  fpos local_b8 [16];
  streamoff local_a8;
  userType local_a0;
  locType *local_10;
  locType *offset_00;
  
  __x = (userType **)(in_RDI + 0x18);
  uVar2 = 0;
  offset_00 = local_10;
  std::ostream::seekp((long)__x,_S_beg);
  std::ios::clear(in_RDI + 8 + *(long *)(*(long *)(in_RDI + 8) + -0x18),uVar2);
  userType::userType(&local_a0);
  local_b8 = (fpos  [16])std::ostream::tellp();
  local_a8 = std::fpos::operator_cast_to_long(local_b8);
  std::ostream::write((char *)__x,(long)&local_a0);
  LRUCache<sjtu::userType>::load(unaff_retaddr,offset_00);
  pVar1 = std::make_pair<sjtu::userType*,long&>
                    (__x,(long *)CONCAT44(uVar2,in_stack_ffffffffffffff18));
  return pVar1;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}